

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# airport.cpp
# Opt level: O0

void __thiscall
Airport::Airport(Airport *this,
                map<unsigned_int,_Ticket,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
                *tickets,uint runway_strips,string *name)

{
  string *name_local;
  uint runway_strips_local;
  map<unsigned_int,_Ticket,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
  *tickets_local;
  Airport *this_local;
  
  std::
  map<unsigned_int,_Ticket,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Ticket>_>_>
  ::map(&this->tickets,tickets);
  this->runway_strips = runway_strips;
  std::__cxx11::string::string((string *)&this->name,name);
  return;
}

Assistant:

Airport::Airport(std::map<unsigned,Ticket> tickets, unsigned runway_strips, string name)
: tickets(tickets), runway_strips(runway_strips), name(name){}